

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeDrop(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  Expression *value;
  Drop *pDVar1;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  type_00 = getConcreteType(this);
  value = make(this,type_00);
  pDVar1 = Builder::makeDrop(&this->builder,value);
  return (Expression *)pDVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeDrop(Type type) {
  return builder.makeDrop(make(getConcreteType()));
}